

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void pack_txb_tokens(aom_writer *w,AV1_COMMON *cm,MACROBLOCK *x,TokenExtra **tp,TokenExtra *tok_end,
                    MACROBLOCKD *xd,MB_MODE_INFO *mbmi,int plane,BLOCK_SIZE plane_bsize,
                    aom_bit_depth_t bit_depth,int block,int blk_row,int blk_col,TX_SIZE tx_size,
                    TOKEN_STATS *token_stats)

{
  TokenExtra TVar1;
  byte bVar2;
  int iVar3;
  TokenExtra TVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  MB_MODE_INFO *mbmi_00;
  undefined3 in_stack_00000019;
  undefined8 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  TX_SIZE in_stack_ffffffffffffff90;
  
  mbmi_00 = (MB_MODE_INFO *)((ulong)mbmi & 0xff);
  uVar6 = (uint)mbmi_00[0x711c].interintra_mode;
  iVar12 = (int)xd;
  if (*(int *)(tp + 0x3e0) < 0) {
    uVar6 = (uint)mbmi_00[0x711c].interintra_mode +
            (*(int *)(tp + 0x3e0) >> (*(char *)(tp + (long)iVar12 * 0x146 + 3) + 3U & 0x1f));
  }
  bVar2 = (byte)mbmi_00[0x711c].wm_params.wmmat[1];
  uVar9 = (uint)bVar2;
  if (*(int *)(tp + 0x3df) < 0) {
    uVar9 = (uint)bVar2 +
            (*(int *)(tp + 0x3df) >> (*(char *)((long)tp + (long)iVar12 * 0xa30 + 0x14) + 3U & 0x1f)
            );
  }
  iVar7 = ((int)uVar6 >> 2) - _plane_bsize;
  if ((iVar7 != 0 && _plane_bsize <= (int)uVar6 >> 2) &&
     (iVar10 = ((int)uVar9 >> 2) - bit_depth, iVar10 != 0 && (int)bit_depth <= (int)uVar9 >> 2)) {
    if (iVar12 == 0) {
      TVar4 = tok_end[(long)(((int)bit_depth >>
                             ((byte)mbmi_00[0x711d].palette_mode_info.palette_colors[1] & 0x1f)) +
                            ((_plane_bsize >>
                             ((byte)mbmi_00[0x711d].palette_mode_info.palette_colors[0x11] & 0x1f))
                            << (mbmi_00[0x711d].inter_tx_size[0xe] & 0x1f))) + 0x92];
    }
    else {
      TVar1 = *(TokenExtra *)
               ("" + av1_ss_size_lookup[(byte)*tok_end]
                     [*(int *)((long)tp + (long)iVar12 * 0xa30 + 0x14)]
                     [*(int *)(tp + (long)iVar12 * 0x146 + 3)]);
      if ((byte)TVar1 < 0x11) {
        TVar4 = (TokenExtra)0x3;
        if ((1 < (byte)TVar1 - 0xb) && (TVar1 != (TokenExtra)0x4)) {
          TVar4 = TVar1;
        }
      }
      else if (TVar1 == (TokenExtra)0x11) {
        TVar4 = (TokenExtra)0x9;
      }
      else {
        TVar4 = TVar1;
        if (TVar1 == (TokenExtra)0x12) {
          TVar4 = (TokenExtra)0xa;
        }
      }
    }
    if ((iVar12 == 0) && (TVar4 != block._0_1_)) {
      uVar13 = (ulong)((block & 0xffU) * 4);
      iVar12 = *(int *)((long)tx_size_high_unit + uVar13);
      if (iVar12 < iVar7) {
        iVar7 = iVar12;
      }
      iVar12 = *(int *)((long)tx_size_wide_unit + uVar13);
      if (iVar12 < iVar10) {
        iVar10 = iVar12;
      }
      if (0 < iVar7) {
        bVar2 = ""[(byte)block._0_1_];
        iVar12 = tx_size_wide_unit[bVar2];
        iVar3 = tx_size_high_unit[bVar2];
        iVar5 = iVar3 * iVar12;
        iVar11 = 0;
        do {
          if (0 < iVar10) {
            iVar8 = 0;
            do {
              pack_txb_tokens(w,cm,x,tp,tok_end,(MACROBLOCKD *)0x0,mbmi_00,plane,
                              plane_bsize + (char)iVar11,bit_depth + iVar8,(uint)bVar2,
                              (int)in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                              in_stack_ffffffffffffff90,(TOKEN_STATS *)CONCAT44(iVar5,iVar7));
              plane = plane + iVar5;
              iVar8 = iVar8 + iVar12;
            } while (iVar8 < iVar10);
          }
          iVar11 = iVar11 + iVar3;
        } while (iVar11 < iVar7);
      }
    }
    else {
      av1_write_coeffs_txb(cm,x,w,_plane_bsize,bit_depth,iVar12,plane,(TX_SIZE)block._0_1_);
    }
  }
  return;
}

Assistant:

static inline void pack_txb_tokens(
    aom_writer *w, AV1_COMMON *cm, MACROBLOCK *const x, const TokenExtra **tp,
    const TokenExtra *const tok_end, MACROBLOCKD *xd, MB_MODE_INFO *mbmi,
    int plane, BLOCK_SIZE plane_bsize, aom_bit_depth_t bit_depth, int block,
    int blk_row, int blk_col, TX_SIZE tx_size, TOKEN_STATS *token_stats) {
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const TX_SIZE plane_tx_size =
      plane ? av1_get_max_uv_txsize(mbmi->bsize, pd->subsampling_x,
                                    pd->subsampling_y)
            : mbmi->inter_tx_size[av1_get_txb_size_index(plane_bsize, blk_row,
                                                         blk_col)];

  if (tx_size == plane_tx_size || plane) {
    av1_write_coeffs_txb(cm, x, w, blk_row, blk_col, plane, block, tx_size);
#if CONFIG_RD_DEBUG
    TOKEN_STATS tmp_token_stats;
    init_token_stats(&tmp_token_stats);
    token_stats->cost += tmp_token_stats.cost;
#endif
  } else {
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int step = bsh * bsw;
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);

    assert(bsw > 0 && bsh > 0);

    for (int r = 0; r < row_end; r += bsh) {
      const int offsetr = blk_row + r;
      for (int c = 0; c < col_end; c += bsw) {
        const int offsetc = blk_col + c;
        pack_txb_tokens(w, cm, x, tp, tok_end, xd, mbmi, plane, plane_bsize,
                        bit_depth, block, offsetr, offsetc, sub_txs,
                        token_stats);
        block += step;
      }
    }
  }
}